

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathFuncs.cpp
# Opt level: O2

Type * __thiscall
slang::ast::builtins::CountBitsFunction::checkArguments
          (CountBitsFunction *this,ASTContext *context,Args *args,SourceRange range,
          Expression *param_4)

{
  Compilation *pCVar1;
  pointer ppEVar2;
  size_t sVar3;
  bool bVar4;
  Type *pTVar5;
  SourceLocation SVar6;
  Expression *arg;
  long lVar7;
  SourceRange sourceRange;
  
  SVar6 = range.startLoc;
  pCVar1 = ((context->scope).ptr)->compilation;
  bVar4 = SystemSubroutine::checkArgCount
                    (&this->super_SystemSubroutine,context,false,args,range,2,0x7fffffff);
  if (bVar4) {
    bVar4 = Type::isBitstreamType(((*args->_M_ptr)->type).ptr,false);
    arg = *args->_M_ptr;
    if (bVar4) {
      sourceRange.endLoc = SVar6;
      sourceRange.startLoc = (arg->sourceRange).endLoc;
      bVar4 = Bitstream::checkClassAccess
                        ((Bitstream *)(arg->type).ptr,(Type *)context,
                         (ASTContext *)(arg->sourceRange).startLoc,sourceRange);
      if (!bVar4) goto LAB_00388786;
      ppEVar2 = args->_M_ptr;
      sVar3 = (args->_M_extent)._M_extent_value;
      lVar7 = 8;
      do {
        if (sVar3 << 3 == lVar7) {
          return pCVar1->intType;
        }
        arg = *(Expression **)((long)ppEVar2 + lVar7);
        bVar4 = Type::isIntegral((arg->type).ptr);
        lVar7 = lVar7 + 8;
      } while (bVar4);
    }
    pTVar5 = SystemSubroutine::badArg(&this->super_SystemSubroutine,context,arg);
    return pTVar5;
  }
LAB_00388786:
  return pCVar1->errorType;
}

Assistant:

const Type& checkArguments(const ASTContext& context, const Args& args, SourceRange range,
                               const Expression*) const final {
        auto& comp = context.getCompilation();
        if (!checkArgCount(context, false, args, range, 2, INT32_MAX))
            return comp.getErrorType();

        if (!args[0]->type->isBitstreamType())
            return badArg(context, *args[0]);

        if (!Bitstream::checkClassAccess(*args[0]->type, context, args[0]->sourceRange))
            return comp.getErrorType();

        for (auto arg : args.subspan(1)) {
            if (!arg->type->isIntegral())
                return badArg(context, *arg);
        }

        return comp.getIntType();
    }